

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

void ft_stroke_border_export(SW_FT_StrokeBorder border,SW_FT_Outline *outline)

{
  short *in_RSI;
  uint *in_RDI;
  SW_FT_Short idx;
  SW_FT_Short *write_1;
  SW_FT_Byte *tags;
  SW_FT_UInt count_1;
  SW_FT_Byte *write;
  SW_FT_Byte *read;
  SW_FT_UInt count;
  short local_42;
  short *local_40;
  byte *local_38;
  uint local_2c;
  undefined1 *local_28;
  byte *local_20;
  uint local_14;
  
  memcpy((void *)(*(long *)(in_RSI + 4) + (long)(int)in_RSI[1] * 0x10),*(void **)(in_RDI + 2),
         (ulong)*in_RDI << 4);
  local_20 = *(byte **)(in_RDI + 4);
  local_28 = (undefined1 *)(*(long *)(in_RSI + 8) + (long)(int)in_RSI[1]);
  for (local_14 = *in_RDI; local_14 != 0; local_14 = local_14 - 1) {
    if ((*local_20 & 1) == 0) {
      if ((*local_20 & 2) == 0) {
        *local_28 = 0;
      }
      else {
        *local_28 = 2;
      }
    }
    else {
      *local_28 = 1;
    }
    local_20 = local_20 + 1;
    local_28 = local_28 + 1;
  }
  local_38 = *(byte **)(in_RDI + 4);
  local_40 = (short *)(*(long *)(in_RSI + 0xc) + (long)(int)*in_RSI * 2);
  local_42 = in_RSI[1];
  for (local_2c = *in_RDI; local_2c != 0; local_2c = local_2c - 1) {
    if ((*local_38 & 8) != 0) {
      *local_40 = local_42;
      *in_RSI = *in_RSI + 1;
      local_40 = local_40 + 1;
    }
    local_38 = local_38 + 1;
    local_42 = local_42 + 1;
  }
  in_RSI[1] = in_RSI[1] + (short)*in_RDI;
  return;
}

Assistant:

static void ft_stroke_border_export(SW_FT_StrokeBorder border,
                                    SW_FT_Outline*     outline)
{
    /* copy point locations */
    memcpy(outline->points + outline->n_points, border->points,
           border->num_points * sizeof(SW_FT_Vector));

    /* copy tags */
    {
        SW_FT_UInt  count = border->num_points;
        SW_FT_Byte* read = border->tags;
        SW_FT_Byte* write = (SW_FT_Byte*)outline->tags + outline->n_points;

        for (; count > 0; count--, read++, write++) {
            if (*read & SW_FT_STROKE_TAG_ON)
                *write = SW_FT_CURVE_TAG_ON;
            else if (*read & SW_FT_STROKE_TAG_CUBIC)
                *write = SW_FT_CURVE_TAG_CUBIC;
            else
                *write = SW_FT_CURVE_TAG_CONIC;
        }
    }

    /* copy contours */
    {
        SW_FT_UInt   count = border->num_points;
        SW_FT_Byte*  tags = border->tags;
        SW_FT_Short* write = outline->contours + outline->n_contours;
        SW_FT_Short  idx = (SW_FT_Short)outline->n_points;

        for (; count > 0; count--, tags++, idx++) {
            if (*tags & SW_FT_STROKE_TAG_END) {
                *write++ = idx;
                outline->n_contours++;
            }
        }
    }

    outline->n_points = (short)(outline->n_points + border->num_points);

    assert(SW_FT_Outline_Check(outline) == 0);
}